

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoCompress.c
# Opt level: O2

void WritePTLen(INT32 Number,INT32 nbit,INT32 Special)

{
  char *pcVar1;
  byte bVar2;
  int Number_00;
  UINT32 UVar3;
  uint Value;
  uint Value_00;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar7 = (ulong)(uint)Number;
  UVar3 = Number + 1;
  do {
    Value = Number >> 0x1f & Number;
    if ((int)uVar7 < 1) break;
    UVar3 = UVar3 - 1;
    pcVar1 = &DAT_0028902f + uVar7;
    uVar7 = uVar7 - 1;
    Value = UVar3;
  } while (*pcVar1 == '\0');
  PutBits(nbit,Value);
  uVar7 = 6;
  if (6 < Special) {
    uVar7 = (ulong)(uint)Special;
  }
  uVar5 = 0;
  while (iVar4 = (int)uVar5, iVar4 < (int)Value) {
    bVar2 = mPTLen[iVar4];
    if (bVar2 < 7) {
      Number_00 = 3;
      Value_00 = (uint)bVar2;
    }
    else {
      Number_00 = bVar2 - 3;
      Value_00 = (1 << ((byte)Number_00 & 0x1f)) - 2;
    }
    PutBits(Number_00,Value_00);
    uVar5 = (ulong)(iVar4 + 1U);
    uVar6 = (long)Special;
    if (iVar4 + 1U == Special) {
      for (; (uVar5 = uVar7, (long)uVar6 < 6 && (uVar5 = uVar6, mPTLen[uVar6] == '\0'));
          uVar6 = uVar6 + 1) {
      }
      PutBits(2,(int)uVar5 + 1U & 3);
    }
  }
  return;
}

Assistant:

STATIC 
VOID 
WritePTLen (
  IN INT32 n, 
  IN INT32 nbit, 
  IN INT32 Special
  )
/*++

Routine Description:

  Outputs the code length array for the Extra Set or the Position Set.
  
Arguments:

  n       - the number of symbols
  nbit    - the number of bits needed to represent 'n'
  Special - the special symbol that needs to be take care of
  
Returns: (VOID)

--*/
{
  INT32 i, k;

  while (n > 0 && mPTLen[n - 1] == 0) {
    n--;
  }
  PutBits(nbit, n);
  i = 0;
  while (i < n) {
    k = mPTLen[i++];
    if (k <= 6) {
      PutBits(3, k);
    } else {
      PutBits(k - 3, (1U << (k - 3)) - 2);
    }
    if (i == Special) {
      while (i < 6 && mPTLen[i] == 0) {
        i++;
      }
      PutBits(2, (i - 3) & 3);
    }
  }
}